

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O1

void __thiscall
tchecker::zg::details::local_m_extrapolation_t::local_m_extrapolation_t
          (local_m_extrapolation_t *this,
          shared_ptr<const_tchecker::clockbounds::local_m_map_t> *clock_bounds)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  clock_id_t cVar2;
  map_t *pmVar3;
  
  (this->super_extrapolation_t)._vptr_extrapolation_t =
       (_func_int **)&PTR__local_m_extrapolation_t_0027da20;
  this->_m = (map_t *)0x0;
  (this->_clock_bounds).
  super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (clock_bounds->
         super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>)
         ._M_ptr;
  p_Var1 = (clock_bounds->
           super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->_clock_bounds).
  super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  cVar2 = clockbounds::local_m_map_t::clock_number
                    ((this->_clock_bounds).
                     super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  pmVar3 = clockbounds::allocate_map((ulong)cVar2);
  this->_m = pmVar3;
  return;
}

Assistant:

local_m_extrapolation_t::local_m_extrapolation_t(
    std::shared_ptr<tchecker::clockbounds::local_m_map_t const> const & clock_bounds)
    : _m(nullptr), _clock_bounds(clock_bounds)
{
  _m = tchecker::clockbounds::allocate_map(_clock_bounds->clock_number());
}